

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O3

bool __thiscall cashew::JSPrinter::endsInBlock(JSPrinter *this,Ref node)

{
  char cVar1;
  bool bVar2;
  Ref *pRVar3;
  undefined8 *puVar4;
  Ref local_20;
  Ref node_local;
  
  local_20.inst = node.inst;
  if ((node.inst)->type == Array) {
    pRVar3 = (Ref *)cashew::Ref::operator[]((uint)&local_20);
    cVar1 = cashew::Ref::operator==(pRVar3,(IString *)&BLOCK);
    if (cVar1 != '\0') {
      return true;
    }
    if ((local_20.inst)->type == Array) {
      pRVar3 = (Ref *)cashew::Ref::operator[]((uint)&local_20);
      cVar1 = cashew::Ref::operator==(pRVar3,(IString *)&LABEL);
      if (cVar1 != '\0') {
        puVar4 = (undefined8 *)cashew::Ref::operator[]((uint)&local_20);
        bVar2 = endsInBlock(this,(Value *)*puVar4);
        if (bVar2) {
          return true;
        }
      }
    }
  }
  if ((local_20.inst)->type == Array) {
    pRVar3 = (Ref *)cashew::Ref::operator[]((uint)&local_20);
    cVar1 = cashew::Ref::operator==(pRVar3,(IString *)&IF);
    if (cVar1 != '\0') {
      ifHasElse(local_20);
      puVar4 = (undefined8 *)cashew::Ref::operator[]((uint)&local_20);
      bVar2 = endsInBlock(this,(Value *)*puVar4);
      if (bVar2) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool endsInBlock(Ref node) {
    if (node->isArray() && node[0] == BLOCK) {
      return true;
    }
    // Check for a label on a block
    if (node->isArray() && node[0] == LABEL && endsInBlock(node[2])) {
      return true;
    }
    // Check for an if
    if (node->isArray() && node[0] == IF &&
        endsInBlock(ifHasElse(node) ? node[3] : node[2])) {
      return true;
    }
    return false;
  }